

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

QString * __thiscall
QSqlRelationalTableModel::selectStatement
          (QString *__return_storage_ptr__,QSqlRelationalTableModel *this)

{
  QSqlRecord *this_00;
  QSqlDatabase *this_01;
  long lVar1;
  Data *pDVar2;
  undefined1 auVar3 [8];
  char16_t *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QSqlRecord QVar7;
  qsizetype qVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  QSqlDriver *pQVar12;
  Node<QString,_int> *pNVar13;
  int *piVar14;
  QSqlRelationalTableModelPrivate *pQVar15;
  long *plVar16;
  pointer pQVar17;
  QString *pQVar18;
  QSqlErrorPrivate *pQVar19;
  undefined8 *puVar20;
  QString *pQVar21;
  qsizetype *pqVar22;
  QSqlErrorPrivate *pQVar23;
  QSqlErrorPrivate *in_RCX;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *__writefds;
  long lVar24;
  timeval *in_R8;
  QSqlErrorPrivate *pQVar25;
  long lVar26;
  long lVar27;
  QSqlErrorPrivate *pQVar28;
  long in_FS_OFFSET;
  QLatin1String QVar29;
  QByteArrayView QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QSqlRecord rec;
  QSqlErrorPrivate *local_258;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> local_250;
  QSqlErrorPrivate *local_240;
  QSqlErrorPrivate *local_220;
  QSqlErrorPrivate *local_208;
  QSqlErrorPrivate *local_200;
  QString *local_1f8;
  char *local_1f0;
  QString local_1d8;
  QString local_1c0;
  undefined1 local_1a8 [8];
  QSqlErrorPrivate *pQStack_1a0;
  QSqlErrorPrivate *local_198;
  QString local_188;
  undefined1 local_168 [72];
  undefined1 auStack_120 [8];
  undefined1 local_118 [16];
  QString local_108;
  QString local_e8;
  QSqlError local_c8;
  Data *pDStack_c0;
  QSqlErrorPrivate *local_b8;
  QSqlRecord local_a8;
  QSqlErrorPrivate *pQStack_a0;
  QSqlErrorPrivate *local_98;
  Data *local_88;
  QString *pQStack_80;
  qsizetype local_78;
  QHash<QString,_int> local_70;
  QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String> local_68
  ;
  QSqlError local_38;
  
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  lVar1 = *(long *)(this + 8);
  QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
  pQVar18 = local_68.a.b;
  if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
    LOCK();
    (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
    }
  }
  if ((QSqlErrorPrivate *)pQVar18 == (QSqlErrorPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_001340b5;
  }
  if (*(long *)(lVar1 + 0x2f8) == 0) {
    QSqlTableModel::selectStatement(__return_storage_ptr__,(QSqlTableModel *)this);
    goto LAB_001340b5;
  }
  local_70.d = (Data<QHashPrivate::Node<QString,_int>_> *)0x0;
  local_88 = (Data *)0x0;
  pQStack_80 = (QString *)0x0;
  local_78 = 0;
  this_00 = (QSqlRecord *)(lVar1 + 0x300);
  iVar10 = QSqlRecord::count(this_00);
  if (0 < iVar10) {
    lVar27 = 0;
    do {
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_68,lVar1 + 0x2e8);
      if ((QSqlErrorPrivate *)local_68.a.a.m_size == (QSqlErrorPrivate *)0x0) {
        lVar24 = 0;
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        pQVar23 = (QSqlErrorPrivate *)0x0;
        pQVar28 = (QSqlErrorPrivate *)0x0;
        local_240 = (QSqlErrorPrivate *)0x0;
        pQVar19 = (QSqlErrorPrivate *)0x0;
        local_220 = (QSqlErrorPrivate *)0x0;
        local_258 = (QSqlErrorPrivate *)0x0;
      }
      else {
        plVar16 = *(long **)(*(long *)(lVar1 + 0x2f0) + lVar27 * 0x10);
        local_258 = (QSqlErrorPrivate *)*plVar16;
        local_220 = (QSqlErrorPrivate *)plVar16[1];
        pQVar19 = (QSqlErrorPrivate *)plVar16[2];
        if (local_258 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        local_240 = (QSqlErrorPrivate *)plVar16[3];
        lVar24 = plVar16[5];
        if (local_240 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QArrayData *)local_240)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_240)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)plVar16[6];
        pQVar23 = (QSqlErrorPrivate *)plVar16[7];
        pQVar28 = (QSqlErrorPrivate *)plVar16[8];
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          (((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSqlRecordPrivate *)local_250.d.ptr)->super_QSharedData).ref.
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
      }
      QSharedPointer<QRelation>::deref((Data *)local_68.a.a.m_data);
      local_a8.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      pQStack_a0 = (QSqlErrorPrivate *)0x0;
      local_98 = (QSqlErrorPrivate *)0x0;
      if ((pQVar19 == (QSqlErrorPrivate *)0x0) ||
         (pQVar28 == (QSqlErrorPrivate *)0x0 || lVar24 == 0)) {
        QSqlRecord::fieldName((QString *)&local_68,this_00,(int)lVar27);
        pQVar18 = local_68.a.b;
        qVar8 = local_68.a.a.m_size;
        pQVar19 = pQStack_a0;
        QVar7.d.d.ptr = local_a8.d.d.ptr;
        local_68.a.a.m_size = (qsizetype)local_a8.d.d.ptr;
        local_a8.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)qVar8;
        pQStack_a0 = (QSqlErrorPrivate *)local_68.a.a.m_data;
        local_68.a.a.m_data = (char *)pQVar19;
        local_68.a.b = (QString *)local_98;
        local_98 = (QSqlErrorPrivate *)pQVar18;
        if (QVar7.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
          LOCK();
          *(int *)QVar7.d.d.ptr = *(int *)QVar7.d.d.ptr + -1;
          UNLOCK();
          if (*(int *)QVar7.d.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)QVar7.d.d.ptr,2,0x10);
          }
        }
      }
      else {
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + 1;
          UNLOCK();
        }
        local_a8.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)local_250.d.ptr;
        pQStack_a0 = pQVar23;
        local_98 = pQVar28;
        pQVar12 = QSqlDatabase::driver((QSqlDatabase *)(lVar1 + 0x228));
        cVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,&local_a8,0);
        if (cVar9 != '\0') {
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)(lVar1 + 0x228));
          in_R8 = *(timeval **)pQVar12;
          (*(code *)in_R8[0xf].tv_usec)(&local_68,pQVar12,&local_a8,0);
          pQVar18 = local_68.a.b;
          qVar8 = local_68.a.a.m_size;
          pQVar23 = pQStack_a0;
          QVar7.d.d.ptr = local_a8.d.d.ptr;
          local_68.a.a.m_size = (qsizetype)local_a8.d.d.ptr;
          local_a8.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)qVar8;
          pQStack_a0 = (QSqlErrorPrivate *)local_68.a.a.m_data;
          local_68.a.a.m_data = (char *)pQVar23;
          local_68.a.b = (QString *)local_98;
          local_98 = (QSqlErrorPrivate *)pQVar18;
          if (QVar7.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)QVar7.d.d.ptr = *(int *)QVar7.d.d.ptr + -1;
            UNLOCK();
            if (*(int *)QVar7.d.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)QVar7.d.d.ptr,2,0x10);
            }
          }
        }
        local_c8.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
             (totally_ordered_wrapper<QSqlErrorPrivate_*>)0xaaaaaaaaaaaaaaaa;
        QSqlTableModel::database((QSqlTableModel *)&local_e8);
        local_68.a.a.m_size = (qsizetype)local_258;
        local_68.a.a.m_data = (char *)local_220;
        if (local_258 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        local_68.a.b = (QString *)pQVar19;
        QSqlDatabase::record((QSqlDatabase *)&local_c8,&local_e8);
        if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_e8);
        iVar10 = QSqlRecord::count((QSqlRecord *)&local_c8);
        if (0 < iVar10) {
          iVar10 = 0;
          do {
            QSqlRecord::fieldName((QString *)&local_68,(QSqlRecord *)&local_c8,iVar10);
            iVar11 = QString::compare((QString *)&local_a8,(CaseSensitivity)&local_68);
            if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>
                               .super_QBasicAtomicInteger<int>._q_value + -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
            if (iVar11 == 0) {
              QSqlRecord::fieldName((QString *)&local_68,(QSqlRecord *)&local_c8,iVar10);
              pQVar18 = local_68.a.b;
              qVar8 = local_68.a.a.m_size;
              pQVar19 = pQStack_a0;
              QVar7.d.d.ptr = local_a8.d.d.ptr;
              local_68.a.a.m_size = (qsizetype)local_a8.d.d.ptr;
              local_a8.d.d.ptr =
                   (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
                   (QExplicitlySharedDataPointer<QSqlRecordPrivate>)qVar8;
              pQStack_a0 = (QSqlErrorPrivate *)local_68.a.a.m_data;
              local_68.a.a.m_data = (char *)pQVar19;
              local_68.a.b = (QString *)local_98;
              local_98 = (QSqlErrorPrivate *)pQVar18;
              if (QVar7.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
                LOCK();
                *(int *)QVar7.d.d.ptr = *(int *)QVar7.d.d.ptr + -1;
                UNLOCK();
                if (*(int *)QVar7.d.d.ptr == 0) {
                  QArrayData::deallocate((QArrayData *)QVar7.d.d.ptr,2,0x10);
                }
              }
              break;
            }
            iVar10 = iVar10 + 1;
            iVar11 = QSqlRecord::count((QSqlRecord *)&local_c8);
          } while (iVar10 < iVar11);
        }
        QSqlRecord::~QSqlRecord((QSqlRecord *)&local_c8);
      }
      if ((local_70.d == (Data<QHashPrivate::Node<QString,_int>_> *)0x0) ||
         (pNVar13 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                              (local_70.d,(QString *)&local_a8),
         pNVar13 == (Node<QString,_int> *)0x0)) {
        piVar14 = (int *)0x0;
      }
      else {
        piVar14 = &pNVar13->value;
      }
      if (piVar14 == (int *)0x0) {
        iVar10 = 1;
      }
      else {
        iVar10 = *piVar14 + 1;
      }
      QHash<QString,int>::tryEmplace_impl<QString_const&>
                ((TryEmplaceResult *)&local_68,&local_70,(QString *)&local_a8);
      pDVar2 = (((QString *)(local_68.a.a.m_size + 0x20))->d).d;
      in_RCX = (QSqlErrorPrivate *)
               ((ulong)*(byte *)((long)&pDVar2[((ulong)local_68.a.a.m_data >> 7) * 9].
                                        super_QArrayData.ref_._q_value +
                                (ulong)((uint)local_68.a.a.m_data & 0x7f)) * 0x20);
      *(int *)((long)&(in_RCX->driverError).d.size +
              *(long *)&pDVar2[((ulong)local_68.a.a.m_data >> 7) * 9 + 8].super_QArrayData) = iVar10
      ;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_88,local_78,(QString *)&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (local_a8.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
        LOCK();
        *(int *)local_a8.d.d.ptr = *(int *)local_a8.d.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_a8.d.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.d.d.ptr,2,0x10);
        }
      }
      if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        *(int *)local_250.d.ptr = *(int *)local_250.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_250.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_250.d.ptr,2,0x10);
        }
      }
      if (local_240 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&local_240->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)&local_240->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&local_240->super_QSharedData)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_240,2,0x10);
        }
      }
      if (local_258 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_258,2,0x10);
        }
      }
      lVar27 = lVar27 + 1;
      iVar10 = QSqlRecord::count(this_00);
    } while (lVar27 < iVar10);
  }
  local_a8.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
  pQStack_a0 = (QSqlErrorPrivate *)0x0;
  local_98 = (QSqlErrorPrivate *)0x0;
  local_c8.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0;
  pDStack_c0 = (Data *)0x0;
  local_b8 = (QSqlErrorPrivate *)0x0;
  local_e8.d.size = -0x5555555555555556;
  local_e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
  QSqlQueryModelSql::from(&local_e8,(QString *)&local_68);
  if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
    LOCK();
    (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
    }
  }
  iVar10 = QSqlRecord::count(this_00);
  __writefds = extraout_RDX;
  if (0 < iVar10) {
    this_01 = (QSqlDatabase *)(lVar1 + 0x228);
    lVar26 = 0;
    lVar24 = 0;
    lVar27 = 0;
    do {
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_68,lVar1 + 0x2e8);
      if ((QSqlErrorPrivate *)local_68.a.a.m_size == (QSqlErrorPrivate *)0x0) {
        local_258 = (QSqlErrorPrivate *)0x0;
        local_200 = (QSqlErrorPrivate *)0x0;
        local_240 = (QSqlErrorPrivate *)0x0;
        local_220 = (QSqlErrorPrivate *)0x0;
        local_1f0 = (char *)0x0;
        local_1f8 = (QString *)0x0;
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0x0;
        local_208 = (QSqlErrorPrivate *)0x0;
        pQVar19 = (QSqlErrorPrivate *)0x0;
      }
      else {
        plVar16 = *(long **)(*(long *)(lVar1 + 0x2f0) + lVar24);
        local_258 = (QSqlErrorPrivate *)*plVar16;
        local_200 = (QSqlErrorPrivate *)plVar16[1];
        local_240 = (QSqlErrorPrivate *)plVar16[2];
        if (local_258 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        local_220 = (QSqlErrorPrivate *)plVar16[3];
        local_1f0 = (char *)plVar16[4];
        local_1f8 = (QString *)plVar16[5];
        if (local_220 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QArrayData *)local_220)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_220)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_250.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)plVar16[6];
        local_208 = (QSqlErrorPrivate *)plVar16[7];
        pQVar19 = (QSqlErrorPrivate *)plVar16[8];
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          (((QSqlErrorPrivate *)local_250.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSqlErrorPrivate *)local_250.d.ptr)->super_QSharedData).ref.
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
      }
      QSharedPointer<QRelation>::deref((Data *)local_68.a.a.m_data);
      local_108.d.size = -0x5555555555555556;
      local_108.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_108.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QSqlTableModel::tableName((QString *)&local_68,(QSqlTableModel *)this);
      pQVar15 = (QSqlRelationalTableModelPrivate *)QSqlDatabase::driver(this_01);
      QSqlRecord::fieldName((QString *)(local_168 + 0x20),this_00,(int)lVar27);
      (**(code **)(*(long *)&(pQVar15->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate +
                  0xa0))((QString *)(local_168 + 0x40),pQVar15,(QString *)(local_168 + 0x20),0);
      QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                (&local_108,pQVar15,(QString *)&local_68,(QString *)(local_168 + 0x40));
      if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_168._64_8_,2,0x10);
        }
      }
      if ((QSqlErrorPrivate *)local_168._32_8_ != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_168._32_8_,2,0x10);
        }
      }
      if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
      if ((local_240 == (QSqlErrorPrivate *)0x0) ||
         (pQVar19 == (QSqlErrorPrivate *)0x0 || local_1f8 == (QString *)0x0)) {
        pQVar18 = &local_108;
        if ((local_98 == (QSqlErrorPrivate *)0x0) ||
           (pQVar18 = (QString *)&local_a8,
           (QSqlErrorPrivate *)local_108.d.size == (QSqlErrorPrivate *)0x0)) {
          local_168._64_8_ = (pQVar18->d).d;
          auStack_120 = (undefined1  [8])(pQVar18->d).ptr;
          in_RCX = (QSqlErrorPrivate *)(pQVar18->d).size;
          local_118._0_8_ = in_RCX;
          if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QArrayData *)&((QSqlErrorPrivate *)local_168._64_8_)->super_QSharedData)->ref_).
            _q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QSqlErrorPrivate *)local_168._64_8_)->super_QSharedData)->ref_).
                 _q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          local_68.a.a.m_size = (qsizetype)local_a8.d.d.ptr;
          local_68.a.a.m_data = (char *)pQStack_a0;
          local_68.a.b = (QString *)local_98;
          if (local_a8.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_a8.d.d.ptr = *(int *)local_a8.d.d.ptr + 1;
            UNLOCK();
          }
          QVar29.m_data = (char *)0x1;
          QVar29.m_size = (qsizetype)&local_68;
          pQVar18 = (QString *)QString::append(QVar29);
          puVar20 = (undefined8 *)QString::append(pQVar18);
          in_RCX = (QSqlErrorPrivate *)*puVar20;
          auStack_120 = (undefined1  [8])puVar20[1];
          local_118._0_8_ = puVar20[2];
          if (in_RCX != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.super___atomic_base<int>.
            _M_i = (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_168._64_8_ = in_RCX;
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        QString::operator=((QString *)&local_a8,(QString *)(local_168 + 0x40));
      }
      else {
        local_118._0_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_168._64_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
        auStack_120 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        QString::number((int)&local_68,(int)lVar27);
        pQVar15 = (QSqlRelationalTableModelPrivate *)0x0;
        plVar16 = (long *)QString::insert((longlong)&local_68,(QLatin1String)(ZEXT816(9) << 0x40));
        local_168._64_8_ = *plVar16;
        auStack_120 = (undefined1  [8])plVar16[1];
        local_118._0_8_ = plVar16[2];
        if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSqlErrorPrivate *)local_168._64_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSqlErrorPrivate *)local_168._64_8_)->super_QSharedData).ref.
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            pQVar15 = (QSqlRelationalTableModelPrivate *)0x2;
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        local_168._48_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
        local_168._32_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
        local_168._40_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_size = (qsizetype)local_250.d.ptr;
        local_68.a.a.m_data = (char *)local_208;
        if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        local_68.a.b = (QString *)pQVar19;
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  ((QString *)(local_168 + 0x20),pQVar15,(QString *)(local_168 + 0x40),
                   (QString *)&local_68);
        if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        pQVar17 = QList<QString>::data((QList<QString> *)&local_88);
        if ((local_70.d == (Data<QHashPrivate::Node<QString,_int>_> *)0x0) ||
           (pNVar13 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                                (local_70.d,(QString *)((long)&(pQVar17->d).d + lVar26)),
           pNVar13 == (Node<QString,_int> *)0x0)) {
          piVar14 = (int *)0x0;
        }
        else {
          piVar14 = &pNVar13->value;
        }
        if ((piVar14 != (int *)0x0) && (1 < *piVar14)) {
          local_168._16_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
          local_168._0_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
          local_168._8_8_ = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
          local_188.d.d = (Data *)local_258;
          local_188.d.ptr = (char16_t *)local_200;
          local_188.d.size = (qsizetype)local_240;
          if (local_258 != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          QString::QString((QString *)&local_68,(QChar)0x2e);
          QString::section(local_168,&local_188,&local_68,0xffffffffffffffff,0xffffffffffffffff,0);
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          if ((QSqlErrorPrivate *)local_188.d.d != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1)
            ;
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
                (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar12 = QSqlDatabase::driver(this_01);
          cVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,local_168,1);
          if (cVar9 != '\0') {
            pQVar12 = QSqlDatabase::driver(this_01);
            (**(code **)(*(long *)pQVar12 + 0xf8))(&local_68,pQVar12,local_168,1);
            pQVar18 = local_68.a.b;
            qVar8 = local_68.a.a.m_size;
            uVar6 = local_168._8_8_;
            uVar5 = local_168._0_8_;
            local_68.a.a.m_size = local_168._0_8_;
            local_168._0_8_ = qVar8;
            local_168._8_8_ = local_68.a.a.m_data;
            local_68.a.a.m_data = (char *)uVar6;
            local_68.a.b = (QString *)local_168._16_8_;
            local_168._16_8_ = pQVar18;
            if ((QSqlErrorPrivate *)uVar5 != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)uVar5)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
              ._q_value = (Type)((int)(((QSharedData *)uVar5)->ref).super_QAtomicInteger<int>.
                                      super_QBasicAtomicInteger<int>._q_value + -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)uVar5)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
              }
            }
          }
          local_188.d.d = (Data *)local_250.d.ptr;
          local_188.d.ptr = (char16_t *)local_208;
          if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          local_188.d.size = (qsizetype)pQVar19;
          pQVar12 = QSqlDatabase::driver(this_01);
          cVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,&local_188,0);
          if (cVar9 != '\0') {
            pQVar12 = QSqlDatabase::driver(this_01);
            (**(code **)(*(long *)pQVar12 + 0xf8))(&local_68,pQVar12,&local_188,0);
            pQVar18 = local_68.a.b;
            qVar8 = local_68.a.a.m_size;
            pcVar4 = local_188.d.ptr;
            pDVar2 = local_188.d.d;
            local_68.a.a.m_size = (qsizetype)local_188.d.d;
            local_188.d.d = (Data *)qVar8;
            local_188.d.ptr = (char16_t *)local_68.a.a.m_data;
            local_68.a.a.m_data = (char *)pcVar4;
            local_68.a.b = (QString *)local_188.d.size;
            local_188.d.size = (qsizetype)pQVar18;
            if ((QSqlErrorPrivate *)pDVar2 != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)&pDVar2->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)&pDVar2->super_QArrayData)->ref).
                               super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value +
                         -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)&pDVar2->super_QArrayData)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
              }
            }
          }
          local_198 = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
          local_1a8 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          pQStack_1a0 = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
          QVar30.m_data = (storage_type *)0x8;
          QVar30.m_size = (qsizetype)&local_68;
          QString::fromLatin1(QVar30);
          pQVar17 = QList<QString>::data((QList<QString> *)&local_88);
          if ((local_70.d == (Data<QHashPrivate::Node<QString,_int>_> *)0x0) ||
             (pNVar13 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                                  (local_70.d,(QString *)((long)&(pQVar17->d).d + lVar26)),
             pNVar13 == (Node<QString,_int> *)0x0)) {
            piVar14 = (int *)0x0;
          }
          else {
            piVar14 = &pNVar13->value;
          }
          if (piVar14 == (int *)0x0) {
            iVar10 = 0;
          }
          else {
            iVar10 = *piVar14;
          }
          QString::number((int)&local_1c0,iVar10);
          QString::arg<QString&,QString&,QString>
                    ((type *)local_1a8,(QString *)&local_68,(QString *)local_168,&local_188,
                     &local_1c0);
          if ((QSqlErrorPrivate *)local_1c0.d.d != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1)
            ;
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
                (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          pQVar12 = QSqlDatabase::driver(this_01);
          (**(code **)(*(long *)pQVar12 + 0x100))(pQVar12,0);
          QString::truncate((longlong)local_1a8);
          pQVar12 = QSqlDatabase::driver(this_01);
          in_R8 = *(timeval **)pQVar12;
          (*(code *)in_R8[10].tv_sec)(&local_68,pQVar12,local_1a8,0);
          pQVar18 = local_68.a.b;
          qVar8 = local_68.a.a.m_size;
          pQVar19 = pQStack_1a0;
          auVar3 = local_1a8;
          local_68.a.a.m_size = (qsizetype)local_1a8;
          local_1a8 = (undefined1  [8])qVar8;
          pQStack_1a0 = (QSqlErrorPrivate *)local_68.a.a.m_data;
          local_68.a.a.m_data = (char *)pQVar19;
          local_68.a.b = (QString *)local_198;
          local_198 = (QSqlErrorPrivate *)pQVar18;
          if (auVar3 != (undefined1  [8])0x0) {
            LOCK();
            (((QSharedData *)auVar3)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value = (Type)((int)(((QSharedData *)auVar3)->ref).super_QAtomicInteger<int>.
                                   super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)auVar3)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)auVar3,2,0x10);
            }
          }
          QSqlQueryModelSql::as
                    ((QString *)&local_68,(QString *)(local_168 + 0x20),(QString *)local_1a8);
          QString::operator=((QString *)(local_168 + 0x20),(QString *)&local_68);
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
          pQVar17 = QList<QString>::data((QList<QString> *)&local_88);
          QHash<QString,int>::tryEmplace_impl<QString_const&>
                    ((TryEmplaceResult *)&local_68,&local_70,
                     (QString *)((long)&(pQVar17->d).d + lVar26));
          pDVar2 = (((QString *)(local_68.a.a.m_size + 0x20))->d).d;
          piVar14 = (int *)(*(long *)&pDVar2[((ulong)local_68.a.a.m_data >> 7) * 9 + 8].
                                      super_QArrayData + 0x18 +
                           (ulong)*(byte *)((long)&pDVar2[((ulong)local_68.a.a.m_data >> 7) * 9].
                                                   super_QArrayData.ref_._q_value +
                                           (ulong)((uint)local_68.a.a.m_data & 0x7f)) * 0x20);
          *piVar14 = *piVar14 + -1;
          if (local_1a8 != (undefined1  [8])0x0) {
            LOCK();
            (((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_1a8,2,0x10);
            }
          }
          if ((QSqlErrorPrivate *)local_188.d.d != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1)
            ;
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
                (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QSqlErrorPrivate *)local_168._0_8_ != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
            }
          }
        }
        pQVar18 = (QString *)(local_168 + 0x20);
        if ((local_98 == (QSqlErrorPrivate *)0x0) ||
           (pQVar18 = (QString *)&local_a8,
           (QSqlErrorPrivate *)local_168._48_8_ == (QSqlErrorPrivate *)0x0)) {
          local_168._0_8_ = (pQVar18->d).d;
          local_168._8_8_ = *(Data **)((long)&pQVar18->d + 8);
          local_168._16_8_ = *(qsizetype *)((long)&pQVar18->d + 0x10);
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_168._0_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_168._0_8_)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          local_68.a.a.m_size = (qsizetype)local_a8.d.d.ptr;
          local_68.a.a.m_data = (char *)pQStack_a0;
          local_68.a.b = (QString *)local_98;
          if (local_a8.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
            LOCK();
            *(int *)local_a8.d.d.ptr = *(int *)local_a8.d.d.ptr + 1;
            UNLOCK();
          }
          QVar31.m_data = (char *)0x1;
          QVar31.m_size = (qsizetype)&local_68;
          pQVar18 = (QString *)QString::append(QVar31);
          plVar16 = (long *)QString::append(pQVar18);
          local_168._0_8_ = *plVar16;
          local_168._8_8_ = plVar16[1];
          local_168._16_8_ = plVar16[2];
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_168._0_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_168._0_8_)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        QString::operator=((QString *)&local_a8,(QString *)local_168);
        if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
          }
        }
        local_168._16_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_168._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
        local_168._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
        local_188.d.d = (Data *)local_200;
        local_1a8 = (undefined1  [8])local_240;
        if (local_258 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        if (local_240 == (QSqlErrorPrivate *)0x0) {
          pQVar18 = (QString *)auStack_120;
          pQVar15 = (QSqlRelationalTableModelPrivate *)local_118;
          pQVar19 = (QSqlErrorPrivate *)local_168._64_8_;
LAB_00133316:
          local_168._0_8_ = pQVar19;
          local_168._8_8_ = (QSqlErrorPrivate *)(pQVar18->d).d;
          local_168._16_8_ =
               *(undefined8 *)&(pQVar15->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate;
          if (pQVar19 != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (pQVar19->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(pQVar19->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
        }
        else {
          pQVar18 = &local_188;
          pQVar15 = (QSqlRelationalTableModelPrivate *)local_1a8;
          pQVar19 = local_258;
          if ((QSqlErrorPrivate *)local_118._0_8_ == (QSqlErrorPrivate *)0x0) goto LAB_00133316;
          local_68.a.a.m_size = (qsizetype)local_258;
          local_68.a.a.m_data = (char *)local_200;
          local_68.a.b = (QString *)local_240;
          if (local_258 != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          QVar32.m_data = (char *)0x1;
          QVar32.m_size = (qsizetype)&local_68;
          pQVar18 = (QString *)QString::append(QVar32);
          pQVar15 = (QSqlRelationalTableModelPrivate *)(local_168 + 0x40);
          plVar16 = (long *)QString::append(pQVar18);
          local_168._0_8_ = *plVar16;
          local_168._8_8_ = plVar16[1];
          local_168._16_8_ = plVar16[2];
          if ((QSqlErrorPrivate *)local_168._0_8_ != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSqlErrorPrivate *)local_168._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>
            .super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSqlErrorPrivate *)local_168._0_8_)->super_QSharedData).ref.
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
            UNLOCK();
          }
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              pQVar15 = (QSqlRelationalTableModelPrivate *)0x2;
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        if (local_258 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            pQVar15 = (QSqlRelationalTableModelPrivate *)0x2;
            QArrayData::deallocate((QArrayData *)local_258,2,0x10);
          }
        }
        local_188.d.size = -0x5555555555555556;
        local_188.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_188.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_size = (qsizetype)local_220;
        local_68.a.a.m_data = local_1f0;
        local_68.a.b = local_1f8;
        if (local_220 != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&local_220->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)&local_220->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  (&local_188,pQVar15,(QString *)(local_168 + 0x40),(QString *)&local_68);
        if ((QArrayData *)local_68.a.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        local_198 = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
        local_1a8 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        pQStack_1a0 = (QSqlErrorPrivate *)0xaaaaaaaaaaaaaaaa;
        local_68.a.a.m_size = (qsizetype)local_108.d.d;
        local_68.a.a.m_data = (char *)local_108.d.ptr;
        local_68.a.b = (QString *)local_108.d.size;
        if ((QSqlErrorPrivate *)local_108.d.d != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        QVar33.m_data = (char *)0x1;
        QVar33.m_size = (qsizetype)&local_68;
        pQVar18 = (QString *)QString::append(QVar33);
        plVar16 = (long *)QString::append(pQVar18);
        local_1a8 = (undefined1  [8])*plVar16;
        pQStack_1a0 = (QSqlErrorPrivate *)plVar16[1];
        local_198 = (QSqlErrorPrivate *)plVar16[2];
        if (local_1a8 != (undefined1  [8])0x0) {
          LOCK();
          (((QSqlErrorPrivate *)local_1a8)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSqlErrorPrivate *)local_1a8)->super_QSharedData).ref.
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
          }
        }
        if (*(int *)(lVar1 + 0x308) == 0) {
          pQVar18 = (QString *)local_168;
          if (((QSqlErrorPrivate *)local_e8.d.size == (QSqlErrorPrivate *)0x0) ||
             (pQVar18 = &local_e8, (QSqlErrorPrivate *)local_168._16_8_ == (QSqlErrorPrivate *)0x0))
          {
            local_1c0.d.d = (pQVar18->d).d;
            local_1c0.d.ptr = (pQVar18->d).ptr;
            in_RCX = (QSqlErrorPrivate *)(pQVar18->d).size;
            local_1c0.d.size = (qsizetype)in_RCX;
            if ((QSqlErrorPrivate *)local_1c0.d.d != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QArrayData *)&((QSqlErrorPrivate *)local_1c0.d.d)->super_QSharedData)->ref_).
              _q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QSqlErrorPrivate *)local_1c0.d.d)->super_QSharedData)->ref_).
                   _q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlErrorPrivate *)local_e8.d.d != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).
                               super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1
                         );
              UNLOCK();
            }
            QVar36.m_data = (char *)0x1;
            QVar36.m_size = (qsizetype)&local_68;
            pQVar18 = (QString *)QString::append(QVar36);
            puVar20 = (undefined8 *)QString::append(pQVar18);
            in_RCX = (QSqlErrorPrivate *)*puVar20;
            local_1c0.d.ptr = (char16_t *)puVar20[1];
            local_1c0.d.size = puVar20[2];
            if (in_RCX != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.super___atomic_base<int>.
              _M_i = (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1c0.d.d = (Data *)in_RCX;
            if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>
                               .super_QBasicAtomicInteger<int>._q_value + -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if ((QSqlErrorPrivate *)local_1c0.d.d != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1)
            ;
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
                (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          QSqlQueryModelSql::et((QString *)&local_68,(QString *)&local_c8,(QString *)local_1a8);
          QString::operator=((QString *)&local_c8,(QString *)&local_68);
          if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
            }
          }
        }
        else {
          pQVar18 = &local_1d8;
          QSqlQueryModelSql::leftJoin(pQVar18,(QString *)local_168);
          if (((QSqlErrorPrivate *)local_e8.d.size == (QSqlErrorPrivate *)0x0) ||
             (pQVar18 = &local_e8, local_1d8.d.size == 0)) {
            local_1c0.d.d = (pQVar18->d).d;
            local_1c0.d.ptr = (pQVar18->d).ptr;
            local_1c0.d.size = (pQVar18->d).size;
            if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_1c0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_1c0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlErrorPrivate *)local_e8.d.d != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).
                               super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1
                         );
              UNLOCK();
            }
            QVar34.m_data = (char *)0x1;
            QVar34.m_size = (qsizetype)&local_68;
            pQVar18 = (QString *)QString::append(QVar34);
            puVar20 = (undefined8 *)QString::append(pQVar18);
            local_1c0.d.d = (Data *)*puVar20;
            local_1c0.d.ptr = (char16_t *)puVar20[1];
            local_1c0.d.size = puVar20[2];
            if ((QArrayData *)local_1c0.d.d != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((QArrayData *)local_1c0.d.d)->ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QArrayData *)local_1c0.d.d)->ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>
                               .super_QBasicAtomicInteger<int>._q_value + -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar18 = &local_1d8;
          QSqlQueryModelSql::on(pQVar18,(QString *)local_1a8);
          if (((QSqlErrorPrivate *)local_e8.d.size == (QSqlErrorPrivate *)0x0) ||
             (pQVar18 = &local_e8, local_1d8.d.size == 0)) {
            local_1c0.d.d = (pQVar18->d).d;
            local_1c0.d.ptr = (pQVar18->d).ptr;
            in_RCX = (QSqlErrorPrivate *)(pQVar18->d).size;
            local_1c0.d.size = (qsizetype)in_RCX;
            if ((QSqlErrorPrivate *)local_1c0.d.d != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QArrayData *)&((QSqlErrorPrivate *)local_1c0.d.d)->super_QSharedData)->ref_).
              _q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QSqlErrorPrivate *)local_1c0.d.d)->super_QSharedData)->ref_).
                   _q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            local_68.a.a.m_size = (qsizetype)local_e8.d.d;
            local_68.a.a.m_data = (char *)local_e8.d.ptr;
            local_68.a.b = (QString *)local_e8.d.size;
            if ((QSqlErrorPrivate *)local_e8.d.d != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).
                               super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1
                         );
              UNLOCK();
            }
            QVar35.m_data = (char *)0x1;
            QVar35.m_size = (qsizetype)&local_68;
            pQVar18 = (QString *)QString::append(QVar35);
            puVar20 = (undefined8 *)QString::append(pQVar18);
            in_RCX = (QSqlErrorPrivate *)*puVar20;
            local_1c0.d.ptr = (char16_t *)puVar20[1];
            local_1c0.d.size = puVar20[2];
            if (in_RCX != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.super___atomic_base<int>.
              _M_i = (((QArrayData *)&in_RCX->super_QSharedData)->ref_)._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1c0.d.d = (Data *)in_RCX;
            if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
              LOCK();
              (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>
                               .super_QBasicAtomicInteger<int>._q_value + -1);
              UNLOCK();
              if ((__atomic_base<int>)
                  *(__int_type *)
                   &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
                QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
              }
            }
          }
          QString::operator=(&local_e8,&local_1c0);
          if ((QSqlErrorPrivate *)local_1c0.d.d != (QSqlErrorPrivate *)0x0) {
            LOCK();
            (((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value =
                 (Type)((int)(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1)
            ;
            UNLOCK();
            if ((__atomic_base<int>)
                *(__int_type *)
                 &(((QSharedData *)&(local_1c0.d.d)->super_QArrayData)->ref).
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
                (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (local_1a8 != (undefined1  [8])0x0) {
          LOCK();
          (((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
          ._q_value = (Type)((int)(((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.
                                  super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_1a8)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_1a8,2,0x10);
          }
        }
        if ((QSqlErrorPrivate *)local_188.d.d != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)&(local_188.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>
                .super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QSqlErrorPrivate *)local_168._0_8_ != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
          }
        }
        if ((QSqlErrorPrivate *)local_168._32_8_ != (QSqlErrorPrivate *)0x0) {
          LOCK();
          (((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value =
               (Type)((int)(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
          UNLOCK();
          if ((__atomic_base<int>)
              *(__int_type *)
               &(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
            QArrayData::deallocate((QArrayData *)local_168._32_8_,2,0x10);
          }
        }
      }
      if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_168._64_8_,2,0x10);
        }
      }
      if ((QSqlErrorPrivate *)local_108.d.d != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).
                         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_250.d.ptr != (QSqlRecordPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_250.d.ptr)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_250.d.ptr,2,0x10);
        }
      }
      if (local_220 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&local_220->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)&local_220->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&local_220->super_QSharedData)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_220,2,0x10);
        }
      }
      if (local_258 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (local_258->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(local_258->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_258,2,0x10);
        }
      }
      lVar27 = lVar27 + 1;
      iVar10 = QSqlRecord::count(this_00);
      lVar24 = lVar24 + 0x10;
      lVar26 = lVar26 + 0x18;
      __writefds = extraout_RDX_00;
    } while (lVar27 < iVar10);
  }
  if (local_98 == (QSqlErrorPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_188.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QSqlQueryModelSql::select((int)&local_108,(fd_set *)&local_a8,__writefds,(fd_set *)in_RCX,in_R8)
    ;
    pQVar18 = &local_e8;
    if (((QSqlErrorPrivate *)local_108.d.size == (QSqlErrorPrivate *)0x0) ||
       (pQVar18 = &local_108, (QSqlErrorPrivate *)local_e8.d.size == (QSqlErrorPrivate *)0x0)) {
      pQVar19 = (QSqlErrorPrivate *)(pQVar18->d).d;
      pQVar23 = (QSqlErrorPrivate *)(pQVar18->d).ptr;
      local_188.d.d = (Data *)(pQVar18->d).size;
      if (pQVar19 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = (qsizetype)local_108.d.d;
      local_68.a.a.m_data = (char *)local_108.d.ptr;
      local_68.a.b = (QString *)local_108.d.size;
      if ((QSqlErrorPrivate *)local_108.d.d != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).
                         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      QVar37.m_data = (char *)0x1;
      QVar37.m_size = (qsizetype)&local_68;
      pQVar18 = (QString *)QString::append(QVar37);
      plVar16 = (long *)QString::append(pQVar18);
      pQVar19 = (QSqlErrorPrivate *)*plVar16;
      pQVar23 = (QSqlErrorPrivate *)plVar16[1];
      local_188.d.d = (Data *)plVar16[2];
      if (pQVar19 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    if ((QSqlErrorPrivate *)local_108.d.d != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).
                       super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_108.d.size = -0x5555555555555556;
    local_108.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_108.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    if (local_b8 == (QSqlErrorPrivate *)0x0) {
      local_168._64_8_ = local_c8.d.d.ptr;
      auStack_120 = (undefined1  [8])pDStack_c0;
      local_118._0_8_ = local_b8;
      if (local_c8.d.d.ptr != (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0) {
        LOCK();
        *(int *)local_c8.d.d.ptr = *(int *)local_c8.d.d.ptr + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = 1;
      local_68.a.a.m_data = "(";
      local_68.a.b = (QString *)&local_c8;
      local_68.b.m_size = 1;
      local_68.b.m_data = ")";
      QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String>::
      convertTo<QString>((QString *)(local_168 + 0x40),&local_68);
    }
    pQVar28 = (QSqlErrorPrivate *)local_168;
    QSqlTableModel::filter((QString *)pQVar28,(QSqlTableModel *)this);
    if ((QSqlErrorPrivate *)local_168._16_8_ == (QSqlErrorPrivate *)0x0) {
      local_168._32_8_ = local_168._0_8_;
      local_168._40_8_ = local_168._8_8_;
      local_168._48_8_ = local_168._16_8_;
      if ((QSqlErrorPrivate *)local_168._0_8_ != (QSqlErrorPrivate *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)local_168._0_8_)->d =
             *(int *)&((DataPointer *)local_168._0_8_)->d + 1;
        UNLOCK();
      }
    }
    else {
      local_68.a.a.m_size = 1;
      local_68.a.a.m_data = "(";
      local_68.b.m_size = 1;
      local_68.b.m_data = ")";
      local_68.a.b = (QString *)pQVar28;
      QStringBuilder<QStringBuilder<const_QLatin1String,_const_QString_&>,_const_QLatin1String>::
      convertTo<QString>((QString *)(local_168 + 0x20),&local_68);
    }
    pQVar18 = (QString *)(local_168 + 0x20);
    QSqlQueryModelSql::et((QString *)&local_68,(QString *)(local_168 + 0x40),pQVar18);
    QSqlQueryModelSql::where(&local_108,(QString *)&local_68);
    if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_168._32_8_ != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)local_168._32_8_)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_168._32_8_,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_168._0_8_ != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)local_168._0_8_)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_168._64_8_,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_188.d.d == (QSqlErrorPrivate *)0x0) {
      pqVar22 = &local_108.d.size;
      pQVar25 = (QSqlErrorPrivate *)local_108.d.d;
      pQVar23 = (QSqlErrorPrivate *)local_108.d.ptr;
LAB_00133e6b:
      local_168._32_8_ = pQVar23;
      local_168._0_8_ = *pqVar22;
      if (pQVar25 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&pQVar25->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&pQVar25->super_QSharedData)->_q_value).super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((QSqlErrorPrivate *)local_108.d.size == (QSqlErrorPrivate *)0x0) {
        pqVar22 = (qsizetype *)&local_188;
        pQVar25 = pQVar19;
        goto LAB_00133e6b;
      }
      local_68.a.b = (QString *)local_188.d.d;
      if (pQVar19 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      QVar38.m_data = (char *)0x1;
      QVar38.m_size = (qsizetype)&local_68;
      local_68.a.a.m_size = (qsizetype)pQVar19;
      local_68.a.a.m_data = (char *)pQVar23;
      pQVar21 = (QString *)QString::append(QVar38);
      plVar16 = (long *)QString::append(pQVar21);
      pQVar25 = (QSqlErrorPrivate *)*plVar16;
      local_168._32_8_ = plVar16[1];
      local_168._0_8_ = plVar16[2];
      if (pQVar25 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    (**(code **)(*(long *)this + 0x1f0))(local_168 + 0x40);
    if ((QSqlErrorPrivate *)local_168._0_8_ == (QSqlErrorPrivate *)0x0) {
      pQVar18 = (QString *)auStack_120;
      pQVar28 = (QSqlErrorPrivate *)local_118;
      pQVar23 = (QSqlErrorPrivate *)local_168._64_8_;
LAB_00133f76:
      (__return_storage_ptr__->d).d = (Data *)pQVar23;
      (__return_storage_ptr__->d).ptr = (char16_t *)(pQVar18->d).d;
      (__return_storage_ptr__->d).size = *(qsizetype *)pQVar28;
      if (pQVar23 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
    }
    else {
      pQVar23 = pQVar25;
      if ((QSqlErrorPrivate *)local_118._0_8_ == (QSqlErrorPrivate *)0x0) goto LAB_00133f76;
      local_68.a.a.m_data = (char *)local_168._32_8_;
      local_68.a.b = (QString *)local_168._0_8_;
      if (pQVar25 != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      QVar39.m_data = (char *)0x1;
      QVar39.m_size = (qsizetype)&local_68;
      local_68.a.a.m_size = (qsizetype)pQVar25;
      pQVar18 = (QString *)QString::append(QVar39);
      plVar16 = (long *)QString::append(pQVar18);
      pDVar2 = (Data *)*plVar16;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (char16_t *)plVar16[1];
      (__return_storage_ptr__->d).size = plVar16[2];
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((QSqlErrorPrivate *)local_68.a.a.m_size != (QSqlErrorPrivate *)0x0) {
        LOCK();
        (((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)
            *(__int_type *)
             &(((QSharedData *)local_68.a.a.m_size)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
          QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,2,0x10);
        }
      }
    }
    if ((QSqlErrorPrivate *)local_168._64_8_ != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)local_168._64_8_)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_168._64_8_,2,0x10);
      }
    }
    if (pQVar25 != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value = (Type)((int)(pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)pQVar25,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_108.d.d != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).
                       super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(((QSharedData *)&(local_108.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar19 != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&pQVar19->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)pQVar19,2,0x10);
      }
    }
  }
  if ((QSqlErrorPrivate *)local_e8.d.d != (QSqlErrorPrivate *)0x0) {
    LOCK();
    (((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(((QSharedData *)&(local_e8.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_c8.d.d.ptr != (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0) {
    LOCK();
    *(int *)local_c8.d.d.ptr = *(int *)local_c8.d.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_c8.d.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.d.d.ptr,2,0x10);
    }
  }
  if (local_a8.d.d.ptr != (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0) {
    LOCK();
    *(int *)local_a8.d.d.ptr = *(int *)local_a8.d.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.d.d.ptr,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
  QHash<QString,_int>::~QHash(&local_70);
LAB_001340b5:
  if ((QExplicitlySharedDataPointer<QSqlErrorPrivate>)
      ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr ==
      local_38.d.d.ptr) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlRelationalTableModel::selectStatement() const
{
    Q_D(const QSqlRelationalTableModel);

    if (tableName().isEmpty())
        return QString();
    if (d->relations.isEmpty())
        return QSqlTableModel::selectStatement();

    // Count how many times each field name occurs in the record
    QHash<QString, int> fieldNames;
    QStringList fieldList;
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        QString name;
        if (relation.isValid()) {
            // Count the display column name, not the original foreign key
            name = relation.displayColumn();
            if (d->db.driver()->isIdentifierEscaped(name, QSqlDriver::FieldName))
                name = d->db.driver()->stripDelimiters(name, QSqlDriver::FieldName);

            const QSqlRecord rec = database().record(relation.tableName());
            for (int i = 0; i < rec.count(); ++i) {
                if (name.compare(rec.fieldName(i), Qt::CaseInsensitive) == 0) {
                    name = rec.fieldName(i);
                    break;
                }
            }
        }
        else {
            name = d->baseRec.fieldName(i);
        }
        fieldNames[name] = fieldNames.value(name, 0) + 1;
        fieldList.append(name);
    }

    QString fList;
    QString conditions;
    QString from = SqlrTm::from(tableName());
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        const QString tableField = d->fullyQualifiedFieldName(tableName(), d->db.driver()->escapeIdentifier(d->baseRec.fieldName(i), QSqlDriver::FieldName));
        if (relation.isValid()) {
            const QString relTableAlias = SqlrTm::relTablePrefix(i);
            QString displayTableField = d->fullyQualifiedFieldName(relTableAlias, relation.displayColumn());

            // Duplicate field names must be aliased
            if (fieldNames.value(fieldList[i]) > 1) {
                QString relTableName = relation.tableName().section(QChar::fromLatin1('.'), -1, -1);
                if (d->db.driver()->isIdentifierEscaped(relTableName, QSqlDriver::TableName))
                    relTableName = d->db.driver()->stripDelimiters(relTableName, QSqlDriver::TableName);
                QString displayColumn = relation.displayColumn();
                if (d->db.driver()->isIdentifierEscaped(displayColumn, QSqlDriver::FieldName))
                    displayColumn = d->db.driver()->stripDelimiters(displayColumn, QSqlDriver::FieldName);
                QString alias = QString::fromLatin1("%1_%2_%3")
                                      .arg(relTableName, displayColumn, QString::number(fieldNames.value(fieldList[i])));
                alias.truncate(d->db.driver()->maximumIdentifierLength(QSqlDriver::FieldName));
                alias = d->db.driver()->escapeIdentifier(alias, QSqlDriver::FieldName);
                displayTableField = SqlrTm::as(displayTableField, alias);
                --fieldNames[fieldList[i]];
            }

            fList = SqlrTm::comma(fList, displayTableField);

            // Join related table
            const QString tblexpr = SqlrTm::concat(relation.tableName(), relTableAlias);
            const QString relTableField = d->fullyQualifiedFieldName(relTableAlias, relation.indexColumn());
            const QString cond = SqlrTm::eq(tableField, relTableField);
            if (d->joinMode == QSqlRelationalTableModel::InnerJoin) {
                // FIXME: InnerJoin code is known to be broken.
                // Use LeftJoin mode if you want correct behavior.
                from = SqlrTm::comma(from, tblexpr);
                conditions = SqlrTm::et(conditions, cond);
            } else {
                from = SqlrTm::concat(from, SqlrTm::leftJoin(tblexpr));
                from = SqlrTm::concat(from, SqlrTm::on(cond));
            }
        } else {
            fList = SqlrTm::comma(fList, tableField);
        }
    }

    if (fList.isEmpty())
        return QString();

    const QString stmt = SqlrTm::concat(SqlrTm::select(fList), from);
    const QString where = SqlrTm::where(SqlrTm::et(SqlrTm::paren(conditions), SqlrTm::paren(filter())));
    return SqlrTm::concat(SqlrTm::concat(stmt, where), orderByClause());
}